

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O3

void __thiscall
gimage::TIFFImageIO::load
          (TIFFImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  uint uVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float ***pppfVar6;
  long lVar7;
  size_type sVar8;
  size_type sVar9;
  float **ppfVar10;
  uint16_t uVar11;
  int iVar12;
  long *plVar13;
  IOException *pIVar14;
  size_type *psVar15;
  uint16_t d;
  long lVar16;
  _Alloc_hider _Var17;
  ulong uVar18;
  long lVar19;
  uint16_t planar;
  uint16_t format;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixel;
  TiffImage<float> tif;
  allocator local_1f9;
  ulong local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [32];
  float *local_1b0;
  float **ppfStack_1a8;
  float ***local_1a0;
  ulong local_198;
  long local_190;
  long local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  TiffImage<float> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar18 = (ulong)(uint)ds;
  local_140.rows.depth = 0;
  local_140.rows.width = 0;
  local_140.rows.height = 0;
  local_140.rows.n = 0;
  local_140.rows.pixel = (float *)0x0;
  local_140.rows.row = (float **)0x0;
  local_140.rows.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_140.rows,0,0,1);
  local_140.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_140.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140.row.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_140.raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_140.row.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_140.row.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_140.tif = (TIFF *)TIFFOpen(name,"r");
  if (local_140.tif == (TIFF *)0x0) {
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_180,name,(allocator *)&local_160);
    std::operator+(&local_1f0,"Can only load TIFF image (",&local_180);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_1d0._0_8_ = *plVar13;
    psVar15 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_1d0._0_8_ == psVar15) {
      local_1d0._16_8_ = *psVar15;
      local_1d0._24_8_ = plVar13[3];
      local_1d0._0_8_ = local_1d0 + 0x10;
    }
    else {
      local_1d0._16_8_ = *psVar15;
    }
    local_1d0._8_8_ = plVar13[1];
    *plVar13 = (long)psVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    gutil::IOException::IOException(pIVar14,(string *)local_1d0);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  TIFFGetField(local_140.tif,0x100,&local_140.width);
  TIFFGetField(local_140.tif,0x101);
  TIFFGetField(local_140.tif,0x115);
  TIFFGetField(local_140.tif,0x102);
  TIFFGetField(local_140.tif,0x153,local_1d0);
  TIFFGetField(local_140.tif,0x11c,&local_1f0);
  local_140.is_float = local_1d0._0_2_ == 3;
  local_140.is_planar = (short)local_1f0._M_dataplus._M_p == 2;
  local_140.raw_size = TIFFScanlineSize(local_140.tif);
  TIFFGetField(local_140.tif,0x106);
  if (0x20 < local_140.bits) {
    pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,name,&local_1f9);
    std::operator+(&local_50,"Image ",&local_b0);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_160._M_dataplus._M_p = (pointer)*plVar13;
    psVar15 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_160._M_dataplus._M_p == psVar15) {
      local_160.field_2._M_allocated_capacity = *psVar15;
      local_160.field_2._8_8_ = plVar13[3];
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar15;
    }
    local_160._M_string_length = plVar13[1];
    *plVar13 = (long)psVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::to_string(&local_70,(uint)local_140.bits);
    std::operator+(&local_180,&local_160,&local_70);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_180);
    local_1f0._M_dataplus._M_p = (pointer)*plVar13;
    psVar15 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_1f0._M_dataplus._M_p == psVar15) {
      local_1f0.field_2._M_allocated_capacity = *psVar15;
      local_1f0.field_2._8_8_ = plVar13[3];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar15;
    }
    local_1f0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::to_string(&local_90,0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   &local_1f0,&local_90);
    gutil::IOException::IOException(pIVar14,(string *)local_1d0);
    __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_1f8 = w;
  if (w < 0) {
    local_1f8 = (ulong)((local_140.width + ds) - 1) / (ulong)(uint)ds;
  }
  if (h < 0) {
    h = ((local_140.height + ds) - 1) / uVar18;
  }
  local_198 = uVar18;
  local_190 = x;
  local_188 = y;
  if (local_140.photometric < 3) {
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (image,(ulong)local_140.width,(ulong)local_140.height,(ulong)local_140.depth);
    if (local_140.is_planar == false) {
      if (h != 0) {
        uVar18 = 0;
        do {
          anon_unknown_6::readRow<float>(image,(uint32_t)uVar18,&local_140,(uint32_t)uVar18,0);
          uVar18 = uVar18 + 1;
        } while (h != uVar18);
      }
    }
    else if (local_140.depth != 0) {
      d = 0;
      uVar11 = local_140.depth;
      do {
        if (h != 0) {
          uVar18 = 0;
          do {
            anon_unknown_6::readRow<float>(image,(uint32_t)uVar18,&local_140,(uint32_t)uVar18,d);
            uVar18 = uVar18 + 1;
            uVar11 = local_140.depth;
          } while (h != uVar18);
        }
        d = d + 1;
      } while (d < uVar11);
    }
    lVar2 = local_188;
    lVar7 = local_190;
    uVar18 = local_1f8;
    if (1 < (int)local_198) {
      downscaleImage<float>
                ((Image<float,_gimage::PixelTraits<float>_> *)local_1d0,image,(int)local_198);
      iVar12 = image->depth;
      image->depth = local_1d0._0_4_;
      local_1d0._0_4_ = iVar12;
      sVar8 = image->width;
      sVar9 = image->height;
      image->width = local_1d0._8_8_;
      image->height = local_1d0._16_8_;
      lVar16 = image->n;
      image->n = local_1d0._24_8_;
      pfVar3 = image->pixel;
      ppfVar10 = image->row;
      image->pixel = local_1b0;
      image->row = ppfStack_1a8;
      pppfVar6 = image->img;
      image->img = local_1a0;
      local_1d0._8_8_ = sVar8;
      local_1d0._16_8_ = sVar9;
      local_1d0._24_8_ = lVar16;
      local_1b0 = pfVar3;
      ppfStack_1a8 = ppfVar10;
      local_1a0 = pppfVar6;
      Image<float,_gimage::PixelTraits<float>_>::~Image
                ((Image<float,_gimage::PixelTraits<float>_> *)local_1d0);
    }
    if (((lVar2 == 0 && lVar7 == 0) && (uVar18 == image->width)) && (h == image->height))
    goto LAB_00147453;
    cropImage<float>((Image<float,_gimage::PixelTraits<float>_> *)local_1d0,image,lVar7,lVar2,uVar18
                     ,h);
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_180,
               (ulong)(local_140.height * local_140.width),(allocator_type *)local_1d0);
    iVar12 = TIFFReadRGBAImageOriented
                       (local_140.tif,local_140.width,local_140.height,local_180._M_dataplus._M_p,1,
                        1);
    if (iVar12 < 1) {
      pIVar14 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_1f0,name,(allocator *)&local_160);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                     "Cannot load image ",&local_1f0);
      gutil::IOException::IOException(pIVar14,(string *)local_1d0);
      __cxa_throw(pIVar14,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (image,(ulong)local_140.width,(ulong)local_140.height,3);
    lVar7 = image->height;
    if (0 < lVar7) {
      lVar2 = image->width;
      pppfVar6 = image->img;
      lVar16 = 0;
      _Var17._M_p = local_180._M_dataplus._M_p;
      do {
        if (0 < lVar2) {
          pfVar3 = (*pppfVar6)[lVar16];
          pfVar4 = pppfVar6[1][lVar16];
          pfVar5 = pppfVar6[2][lVar16];
          lVar19 = 0;
          do {
            uVar1 = *(uint *)_Var17._M_p;
            pfVar3[lVar19] = (float)(uVar1 & 0xff);
            pfVar4[lVar19] = (float)(uVar1 >> 8 & 0xff);
            pfVar5[lVar19] = (float)(uVar1 >> 0x10 & 0xff);
            _Var17._M_p = _Var17._M_p + 4;
            lVar19 = lVar19 + 1;
          } while (lVar2 != lVar19);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar7);
    }
    if ((uint *)local_180._M_dataplus._M_p != (uint *)0x0) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    lVar2 = local_188;
    lVar7 = local_190;
    uVar18 = local_1f8;
    if (1 < (int)local_198) {
      downscaleImage<float>
                ((Image<float,_gimage::PixelTraits<float>_> *)local_1d0,image,(int)local_198);
      iVar12 = image->depth;
      image->depth = local_1d0._0_4_;
      local_1d0._0_4_ = iVar12;
      sVar8 = image->width;
      sVar9 = image->height;
      image->width = local_1d0._8_8_;
      image->height = local_1d0._16_8_;
      lVar16 = image->n;
      image->n = local_1d0._24_8_;
      pfVar3 = image->pixel;
      ppfVar10 = image->row;
      image->pixel = local_1b0;
      image->row = ppfStack_1a8;
      pppfVar6 = image->img;
      image->img = local_1a0;
      local_1d0._8_8_ = sVar8;
      local_1d0._16_8_ = sVar9;
      local_1d0._24_8_ = lVar16;
      local_1b0 = pfVar3;
      ppfStack_1a8 = ppfVar10;
      local_1a0 = pppfVar6;
      Image<float,_gimage::PixelTraits<float>_>::~Image
                ((Image<float,_gimage::PixelTraits<float>_> *)local_1d0);
    }
    if (((lVar2 == 0 && lVar7 == 0) && (uVar18 == image->width)) && (h == image->height))
    goto LAB_00147453;
    cropImage<float>((Image<float,_gimage::PixelTraits<float>_> *)local_1d0,image,lVar7,lVar2,uVar18
                     ,h);
  }
  iVar12 = image->depth;
  image->depth = local_1d0._0_4_;
  local_1d0._0_4_ = iVar12;
  sVar8 = image->width;
  sVar9 = image->height;
  image->width = local_1d0._8_8_;
  image->height = local_1d0._16_8_;
  lVar7 = image->n;
  image->n = local_1d0._24_8_;
  pfVar3 = image->pixel;
  ppfVar10 = image->row;
  image->pixel = local_1b0;
  image->row = ppfStack_1a8;
  pppfVar6 = image->img;
  image->img = local_1a0;
  local_1d0._8_8_ = sVar8;
  local_1d0._16_8_ = sVar9;
  local_1d0._24_8_ = lVar7;
  local_1b0 = pfVar3;
  ppfStack_1a8 = ppfVar10;
  local_1a0 = pppfVar6;
  Image<float,_gimage::PixelTraits<float>_>::~Image
            ((Image<float,_gimage::PixelTraits<float>_> *)local_1d0);
LAB_00147453:
  anon_unknown_6::TiffImage<float>::~TiffImage(&local_140);
  return;
}

Assistant:

void TIFFImageIO::load(ImageFloat &image, const char *name, int ds, long x, long y, long w, long h) const
{
  loadInternal(image, name, ds, x, y, w, h);
}